

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::VectorStringCastOperator<duckdb::StringCast>>
               (hugeint_t *ldata,string_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  Vector *pVVar2;
  idx_t iVar3;
  undefined8 uVar4;
  ulong uVar5;
  idx_t row_idx;
  ulong uVar6;
  char **ppcVar7;
  string_t sVar8;
  hugeint_t input;
  hugeint_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    ppcVar7 = &(result_data->value).pointer.ptr;
    for (uVar6 = 0; count != uVar6; uVar6 = uVar6 + 1) {
      pVVar2 = (Vector *)sel_vector->sel_vector;
      uVar5 = uVar6;
      if (pVVar2 != (Vector *)0x0) {
        uVar5 = (ulong)*(uint *)(&pVVar2->vector_type + uVar6 * 4);
      }
      input_00.upper = (int64_t)dataptr;
      input_00.lower = ldata[uVar5].upper;
      sVar8 = StringCast::Operation<duckdb::hugeint_t>
                        ((StringCast *)ldata[uVar5].lower,input_00,pVVar2);
      uVar4 = sVar8.value._0_8_;
      paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar7 + -1);
      paVar1->length = (int)uVar4;
      paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
      paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
      paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
      paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
      *ppcVar7 = sVar8.value._8_8_;
      ppcVar7 = ppcVar7 + 2;
    }
  }
  else {
    ppcVar7 = &(result_data->value).pointer.ptr;
    for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
      iVar3 = row_idx;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        iVar3 = (idx_t)sel_vector->sel_vector[row_idx];
      }
      pVVar2 = (Vector *)
               (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[iVar3 >> 6];
      if (((ulong)pVVar2 >> (iVar3 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
      else {
        input.upper = (int64_t)dataptr;
        input.lower = ldata[iVar3].upper;
        sVar8 = StringCast::Operation<duckdb::hugeint_t>
                          ((StringCast *)ldata[iVar3].lower,input,pVVar2);
        uVar4 = sVar8.value._0_8_;
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar7 + -1);
        paVar1->length = (int)uVar4;
        paVar1->prefix[0] = (char)((ulong)uVar4 >> 0x20);
        paVar1->prefix[1] = (char)((ulong)uVar4 >> 0x28);
        paVar1->prefix[2] = (char)((ulong)uVar4 >> 0x30);
        paVar1->prefix[3] = (char)((ulong)uVar4 >> 0x38);
        *ppcVar7 = sVar8.value._8_8_;
      }
      ppcVar7 = ppcVar7 + 2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}